

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::callSolveLp(Highs *this,HighsLp *lp,string *message)

{
  string *in_RDX;
  HighsLp *in_RSI;
  long in_RDI;
  HighsLpSolverObject solver_object;
  HighsStatus return_status;
  string *in_stack_00000150;
  Highs *in_stack_00000158;
  string *in_stack_000003b0;
  HighsLpSolverObject *in_stack_000003b8;
  allocator local_c1;
  string local_c0 [48];
  string local_90 [32];
  HighsLpSolverObject local_70;
  HighsStatus local_24;
  HighsStatus local_4;
  
  local_24 = 0;
  HighsLpSolverObject::HighsLpSolverObject
            (&local_70,in_RSI,(HighsBasis *)(in_RDI + 0x70),(HighsSolution *)(in_RDI + 8),
             (HighsInfo *)(in_RDI + 0xea8),(HEkk *)(in_RDI + 0x12f8),
             (HighsCallback *)(in_RDI + 0x9a8),(HighsOptions *)(in_RDI + 0xaa8),
             (HighsTimer *)(in_RDI + 0x920));
  std::__cxx11::string::string(local_90,in_RDX);
  local_24 = solveLp(in_stack_000003b8,in_stack_000003b0);
  std::__cxx11::string::~string(local_90);
  *(HighsModelStatus *)(in_RDI + 0x1244) = local_70.model_status_;
  if (*(int *)(in_RDI + 0x1244) == 7) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"LP",&local_c1);
    local_4 = checkOptimality(in_stack_00000158,in_stack_00000150);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  }
  else {
    local_4 = local_24;
  }
  return local_4;
}

Assistant:

HighsStatus Highs::callSolveLp(HighsLp& lp, const string message) {
  HighsStatus return_status = HighsStatus::kOk;

  HighsLpSolverObject solver_object(lp, basis_, solution_, info_, ekk_instance_,
                                    callback_, options_, timer_);

  // Check that the model is column-wise
  assert(model_.lp_.a_matrix_.isColwise());

  // Solve the LP
  return_status = solveLp(solver_object, message);
  // Extract the model status
  model_status_ = solver_object.model_status_;
  if (model_status_ == HighsModelStatus::kOptimal) return checkOptimality("LP");
  return return_status;
}